

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.h
# Opt level: O3

bool __thiscall
xemmai::t_type_of<long>::f__less(t_type_of<long> *this,intptr_t a_self,t_pvalue *a_value)

{
  ulong uVar1;
  t_type_of<long> *ptVar2;
  long lVar3;
  wstring_view a_message;
  
  uVar1 = *(ulong *)a_self;
  if (uVar1 == 3) {
    ptVar2 = *(t_type_of<long> **)(a_self + 8);
    lVar3 = (long)ptVar2 - (long)this;
  }
  else {
    if (uVar1 == 4) {
      return (double)(long)this < *(double *)(a_self + 8);
    }
    if (((uVar1 < 3) || (*(long *)(*(long *)(uVar1 + 0x40) + 8) == 0)) ||
       (a_value = (t_pvalue *)&v__type_id<long>,
       *(undefined8 **)(*(long *)(*(long *)(uVar1 + 0x40) + 0x10) + 8) != &v__type_id<long>)) {
      a_message._M_str = (wchar_t *)a_value;
      a_message._M_len = (size_t)L"not supported.";
      f_throw((xemmai *)0xe,a_message);
    }
    ptVar2 = *(t_type_of<long> **)(uVar1 + 0x48);
    lVar3 = (long)ptVar2 - (long)this;
  }
  return ptVar2 != this && SBORROW8((long)ptVar2,(long)this) == lVar3 < 0;
}

Assistant:

operator t_object*() const
	{
		return v_p;
	}